

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

cJSON * cJSON_AddNumberToObject(cJSON *object,char *name,double number)

{
  int iVar1;
  cJSON_bool cVar2;
  cJSON *item;
  cJSON_bool in_R8D;
  
  item = (cJSON *)(*global_hooks.allocate)(0x40);
  if (item != (cJSON *)0x0) {
    item->child = (cJSON *)0x0;
    *(undefined8 *)&item->type = 0;
    item->valuedouble = 0.0;
    item->string = (char *)0x0;
    item->valuestring = (char *)0x0;
    *(undefined8 *)&item->valueint = 0;
    item->next = (cJSON *)0x0;
    item->prev = (cJSON *)0x0;
    item->type = 8;
    item->valuedouble = number;
    iVar1 = 0x7fffffff;
    if ((number < 2147483647.0) && (iVar1 = -0x80000000, -2147483648.0 < number)) {
      iVar1 = (int)number;
    }
    item->valueint = iVar1;
  }
  cVar2 = add_item_to_object(object,name,item,(internal_hooks *)0x0,in_R8D);
  if (cVar2 == 0) {
    cJSON_Delete(item);
    item = (cJSON *)0x0;
  }
  return item;
}

Assistant:

CJSON_PUBLIC(cJSON*) cJSON_AddNumberToObject(cJSON * const object, const char * const name, const double number)
{
    cJSON *number_item = cJSON_CreateNumber(number);
    if (add_item_to_object(object, name, number_item, &global_hooks, false))
    {
        return number_item;
    }

    cJSON_Delete(number_item);
    return NULL;
}